

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O0

bool __thiscall GGSock::Communicator::removeErrorCallback(Communicator *this)

{
  bool bVar1;
  lock_guard<std::mutex> lock;
  Data *data;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  function<void_(short)> *in_stack_ffffffffffffffe0;
  
  getData((Communicator *)0x12da63);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffe0,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  bVar1 = std::function::operator_cast_to_bool((function<void_(short)> *)0x12da8f);
  if (bVar1) {
    std::function<void_(short)>::operator=
              (in_stack_ffffffffffffffe0,
               (nullptr_t)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x12dad0);
  return bVar1;
}

Assistant:

bool Communicator::removeErrorCallback() {
        auto & data = getData();

        std::lock_guard<std::mutex> lock(data.mutex);

        if (data.errorCallback) {
            data.errorCallback = nullptr;
            return true;
        }

        return false;
    }